

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

Vector * __thiscall KDIS::DATA_TYPE::Vector::operator-=(Vector *this,Vector *Value)

{
  this->m_f32X = (KFLOAT32)((float)this->m_f32X - (float)Value->m_f32X);
  this->m_f32Y = (KFLOAT32)((float)this->m_f32Y - (float)Value->m_f32Y);
  this->m_f32Z = (KFLOAT32)((float)this->m_f32Z - (float)Value->m_f32Z);
  return this;
}

Assistant:

Vector & Vector::operator -= ( const Vector & Value )
{
    m_f32X -= Value.m_f32X;
    m_f32Y -= Value.m_f32Y;
    m_f32Z -= Value.m_f32Z;
    return *this;
}